

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O0

void TestSignalInClass(void)

{
  __type actual;
  connection local_128;
  code *local_110;
  undefined8 local_108;
  connection local_100;
  undefined1 local_e8 [8];
  TestB tb;
  TestA ta;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string dataB;
  int dataA;
  
  TestRunner::StartTest("TestSignalInClass");
  dataB.field_2._12_4_ = 0x3ff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"DFBZ12Paql",&local_31);
  std::allocator<char>::~allocator(&local_31);
  TestA::TestA((TestA *)&tb.explicitConnectionA._data.
                         super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  TestB::TestB((TestB *)local_e8);
  local_110 = TestB::ReceiveSigA;
  local_108 = 0;
  lsignal::signal<void(int)>::connect<TestB,TestB>
            (&local_100,
             &ta.super_slot._cleaners.
              super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(TestB *)local_e8,0x1337f0,
             (slot *)0x0);
  lsignal::connection::~connection(&local_100);
  lsignal::signal<void(std::__cxx11::string_const&)>::connect<TestA,TestA>
            (&local_128,
             &tb.super_slot._cleaners.
              super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (TestA *)&tb.explicitConnectionA._data.
                       super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,0x133940,(slot *)0x0);
  lsignal::connection::~connection(&local_128);
  lsignal::signal<void_(int)>::operator()
            ((signal<void_(int)> *)
             &ta.super_slot._cleaners.
              super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,dataB.field_2._12_4_);
  lsignal::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()((signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&tb.super_slot._cleaners.
                   super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  AssertHelper::VerifyValue
            (true,(int)tb.sigB._data.
                       super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi == dataB.field_2._12_4_,"Verify dataA");
  actual = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ta.sigA._data.
                            super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_30);
  AssertHelper::VerifyValue(true,actual,"Verify dataB");
  TestB::~TestB((TestB *)local_e8);
  TestA::~TestA((TestA *)&tb.explicitConnectionA._data.
                          super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void TestSignalInClass()
{
	TestRunner::StartTest(MethodName);

	int dataA = 1023;
	std::string dataB = "DFBZ12Paql";
	TestA ta;
	TestB tb;

	ta.sigA.connect(&tb, &TestB::ReceiveSigA, &tb);
	tb.sigB.connect(&ta, &TestA::ReceiveSigB, &ta);

	ta.sigA(dataA);
	tb.sigB(dataB);

	AssertHelper::VerifyValue(true, tb.dataA == dataA, "Verify dataA");
	AssertHelper::VerifyValue(true, ta.dataB == dataB, "Verify dataB");
}